

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O1

bool __thiscall APowerup::HandlePickup(APowerup *this,AInventory *item)

{
  int iVar1;
  PClass *pPVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar5;
  APowerup *power;
  
  if ((item->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
    iVar4 = (**(item->super_AActor).super_DThinker.super_DObject._vptr_DObject)(item);
    (item->super_AActor).super_DThinker.super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4)
    ;
  }
  pPVar2 = (item->super_AActor).super_DThinker.super_DObject.Class;
  if ((this->super_AInventory).super_AActor.super_DThinker.super_DObject.Class == (PClass *)0x0) {
    iVar4 = (**(this->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject)
                      (this);
    (this->super_AInventory).super_AActor.super_DThinker.super_DObject.Class =
         (PClass *)CONCAT44(extraout_var_00,iVar4);
  }
  pPVar3 = (this->super_AInventory).super_AActor.super_DThinker.super_DObject.Class;
  if (pPVar2 != pPVar3) goto LAB_004a2ce0;
  uVar5 = item->ItemFlags;
  iVar4 = *(int *)&item->field_0x4fc;
  if (iVar4 != 0) {
    iVar1 = *(int *)&(this->super_AInventory).field_0x4fc;
    if ((uVar5 >> 9 & 1) == 0) {
      if ((uVar5 >> 10 & 1) == 0 && 0x80 < iVar1) goto LAB_004a2ce0;
      if (iVar1 < iVar4) goto LAB_004a2cbd;
    }
    else {
      iVar4 = iVar4 + iVar1;
LAB_004a2cbd:
      *(int *)&(this->super_AInventory).field_0x4fc = iVar4;
      (this->BlendColor).field_0 = *(anon_union_4_2_12391d7c_for_PalEntry_0 *)(item + 1);
    }
    uVar5 = item->ItemFlags;
  }
  item->ItemFlags = uVar5 | 4;
LAB_004a2ce0:
  return pPVar2 == pPVar3;
}

Assistant:

bool APowerup::HandlePickup (AInventory *item)
{
	if (item->GetClass() == GetClass())
	{
		APowerup *power = static_cast<APowerup*>(item);
		if (power->EffectTics == 0)
		{
			power->ItemFlags |= IF_PICKUPGOOD;
			return true;
		}
		// Color gets transferred if the new item has an effect.

		// Increase the effect's duration.
		if (power->ItemFlags & IF_ADDITIVETIME) 
		{
			EffectTics += power->EffectTics;
			BlendColor = power->BlendColor;
		}
		// If it's not blinking yet, you can't replenish the power unless the
		// powerup is required to be picked up.
		else if (EffectTics > BLINKTHRESHOLD && !(power->ItemFlags & IF_ALWAYSPICKUP))
		{
			return true;
		}
		// Reset the effect duration.
		else if (power->EffectTics > EffectTics)
		{
			EffectTics = power->EffectTics;
			BlendColor = power->BlendColor;
		}
		power->ItemFlags |= IF_PICKUPGOOD;
		return true;
	}
	return false;
}